

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t
internal_exr_calc_header_version_flags(exr_const_context_t_conflict ctxt,uint32_t *flags)

{
  exr_attribute_t *peVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  exr_attr_chlist_entry_t *ce;
  exr_attr_chlist_entry_t *peVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  *flags = 2;
  uVar4 = (uint)(ctxt->is_multipart != '\0') << 0xc;
  *flags = uVar4 | 2;
  if ((0x1f < ctxt->max_name_length) && (0 < (long)ctxt->num_parts)) {
    lVar5 = 0;
    bVar3 = false;
    do {
      uVar6 = (ulong)(ctxt->parts[lVar5]->attributes).num_attributes;
      if (0 < (long)uVar6) {
        uVar9 = 0;
        do {
          peVar1 = (ctxt->parts[lVar5]->attributes).entries[uVar9];
          if ((peVar1->name_length < 0x20) && (peVar1->type_name_length < 0x20)) {
            bVar2 = true;
            if (peVar1->type == EXR_ATTR_CHLIST) {
              uVar10 = (ulong)((peVar1->field_6).chlist)->num_channels;
              if (0 < (long)uVar10) {
                peVar7 = ((peVar1->field_6).chlist)->entries;
                uVar8 = 1;
                do {
                  if (0x1f < (peVar7->name).length) {
                    bVar3 = true;
                    break;
                  }
                  peVar7 = peVar7 + 1;
                  bVar11 = uVar8 < uVar10;
                  uVar8 = uVar8 + 1;
                } while (bVar11);
              }
            }
          }
          else {
            bVar2 = false;
            bVar3 = true;
          }
        } while ((bVar2) && (uVar9 = uVar9 + 1, uVar9 < uVar6));
      }
      if (bVar3) {
        *flags = uVar4 | 0x402;
        break;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != ctxt->num_parts);
  }
  if (ctxt->has_nonimage_data != '\0') {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 8;
  }
  if (ctxt->is_singlepart_tiled != '\0') {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 2;
  }
  return 0;
}

Assistant:

exr_result_t internal_exr_calc_header_version_flags (exr_const_context_t ctxt, uint32_t *flags)
{
    *flags = 2; // EXR_VERSION

    if (ctxt->is_multipart) *flags |= EXR_MULTI_PART_FLAG;

    if (ctxt->max_name_length > EXR_SHORTNAME_MAXLEN)
    {
        int longnamefound = 0;

        for ( int p = 0; p < ctxt->num_parts; ++p )
        {
            exr_priv_part_t curpart = ctxt->parts[p];
            for ( int a = 0; a < curpart->attributes.num_attributes; ++a )
            {
                exr_attribute_t *cura = curpart->attributes.entries[a];
                if (cura->name_length > EXR_SHORTNAME_MAXLEN ||
                    cura->type_name_length > EXR_SHORTNAME_MAXLEN)
                {
                    longnamefound = 1;
                    break;
                }

                // the original C++ side assumes there was
                // only one channel list (who would have multiple)
                // but let's not make that same assertion and check names
                // if we encounter any channel list named anything
                if (cura->type == EXR_ATTR_CHLIST)
                {
                    const exr_attr_chlist_t* chlist = cura->chlist;
                    int nc = chlist->num_channels;

                    for ( int c = 0; c < nc; ++c )
                    {
                        const exr_attr_chlist_entry_t *ce = chlist->entries + c;
                        if (ce->name.length > EXR_SHORTNAME_MAXLEN)
                        {
                            longnamefound = 1;
                            break;
                        }
                    }
                }
            }

            if (longnamefound)
                break;
        }

        if (longnamefound)
            *flags |= EXR_LONG_NAMES_FLAG;
    }

    if (ctxt->has_nonimage_data) *flags |= EXR_NON_IMAGE_FLAG;
    if (ctxt->is_singlepart_tiled) *flags |= EXR_TILED_FLAG;

    return EXR_ERR_SUCCESS;
}